

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O3

Matrix33 *
AML::eulerAngles2DCM_XYZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double local_58;
  double dStack_50;
  double local_48;
  double local_40;
  double dStack_38;
  double local_30;
  double local_28;
  double dStack_20;
  double local_18;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = cos(psi);
  dVar6 = sin(psi);
  local_58 = dVar3 * dVar5;
  dStack_50 = dVar3 * dVar6;
  local_48 = -dVar4;
  local_40 = dVar4 * dVar5 * dVar2 + -dVar6 * dVar1;
  dStack_38 = dVar4 * dVar6 * dVar2 + dVar5 * dVar1;
  local_30 = dVar2 * dVar3;
  local_28 = dVar1 * dVar4 * dVar5 + dVar6 * dVar2;
  dStack_20 = dVar1 * dVar4 * dVar6 + -dVar5 * dVar2;
  local_18 = dVar1 * dVar3;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_58);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngles2DCM_XYZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cosPsi = cos(psi);
        const double sinPsi = sin(psi);

        double data[3][3];
        data[0][0] = cosPsi * cosTheta;
        data[0][1] = cosTheta * sinPsi;
        data[0][2] = -sinTheta;
        data[1][0] = cosPsi * sinTheta * sinPhi - sinPsi * cosPhi;
        data[1][1] = sinPsi * sinTheta * sinPhi + cosPsi * cosPhi;
        data[1][2] = sinPhi * cosTheta;
        data[2][0] = cosPsi * sinTheta * cosPhi + sinPsi * sinPhi;
        data[2][1] = sinPsi * sinTheta * cosPhi - cosPsi * sinPhi;
        data[2][2] = cosTheta * cosPhi;
        return Matrix33(data);
    }